

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O0

void __thiscall
upb::generator::Plugin::AddOutputFile(Plugin *this,string_view filename,string_view content)

{
  google_protobuf_compiler_CodeGeneratorResponse *msg;
  upb_Arena *arena;
  google_protobuf_compiler_CodeGeneratorResponse_File *msg_00;
  upb_StringView uVar1;
  google_protobuf_compiler_CodeGeneratorResponse_File *file;
  Plugin *this_local;
  string_view content_local;
  string_view filename_local;
  
  msg = this->response_;
  arena = Arena::ptr(&this->arena_);
  msg_00 = google_protobuf_compiler_CodeGeneratorResponse_add_file(msg,arena);
  uVar1 = StringDup(this,filename);
  google_protobuf_compiler_CodeGeneratorResponse_File_set_name(msg_00,uVar1);
  uVar1 = StringDup(this,content);
  google_protobuf_compiler_CodeGeneratorResponse_File_set_content(msg_00,uVar1);
  return;
}

Assistant:

void AddOutputFile(absl::string_view filename, absl::string_view content) {
    UPB_DESC(compiler_CodeGeneratorResponse_File)* file = UPB_DESC(
        compiler_CodeGeneratorResponse_add_file)(response_, arena_.ptr());
    UPB_DESC(compiler_CodeGeneratorResponse_File_set_name)
    (file, StringDup(filename));
    UPB_DESC(compiler_CodeGeneratorResponse_File_set_content)
    (file, StringDup(content));
  }